

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

LoopConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopConstraintSyntax,slang::parsing::Token&,slang::syntax::ForeachLoopListSyntax&,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,Token *args,ForeachLoopListSyntax *args_1,
          ConstraintItemSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  LoopConstraintSyntax *pLVar6;
  
  pLVar6 = (LoopConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LoopConstraintSyntax *)this->endPtr < pLVar6 + 1) {
    pLVar6 = (LoopConstraintSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pLVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pLVar6->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pLVar6->super_ConstraintItemSyntax).super_SyntaxNode.kind = LoopConstraint;
  (pLVar6->foreachKeyword).kind = TVar2;
  (pLVar6->foreachKeyword).field_0x2 = uVar3;
  (pLVar6->foreachKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pLVar6->foreachKeyword).rawLen = uVar5;
  (pLVar6->foreachKeyword).info = pIVar1;
  (pLVar6->loopList).ptr = args_1;
  (pLVar6->constraints).ptr = args_2;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pLVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pLVar6;
  return pLVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }